

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteMessageDocComment(Printer *printer,Descriptor *message)

{
  bool bVar1;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  EscapeJavadoc((string *)local_70,*(string **)(message + 8));
  io::Printer::Print(printer,"/**\n * Protobuf type {@code $fullname$}\n","fullname",
                     (string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  local_70._24_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_70._16_8_ = &local_50;
  local_40._M_p = (pointer)&local_30;
  bVar1 = Descriptor::GetSourceLocation(message,(SourceLocation *)local_70);
  if (bVar1) {
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,
                    CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._16_8_ != &local_50) {
    operator_delete((void *)local_70._16_8_,
                    CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1);
  }
  io::Printer::Print(printer," */\n");
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message) {
  printer->Print(
    "/**\n"
    " * Protobuf type {@code $fullname$}\n",
    "fullname", EscapeJavadoc(message->full_name()));
  WriteDocCommentBody(printer, message);
  printer->Print(" */\n");
}